

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_file_cache.c
# Opt level: O3

ngx_int_t ngx_http_file_cache_name(ngx_http_request_t *r,ngx_path_t *path)

{
  ngx_http_cache_t *pnVar1;
  size_t sVar2;
  size_t sVar3;
  ngx_log_t *log;
  u_char *puVar4;
  
  pnVar1 = r->cache;
  if ((pnVar1->file).name.len == 0) {
    sVar2 = (path->name).len;
    sVar3 = path->len;
    (pnVar1->file).name.len = sVar2 + sVar3 + 0x21;
    puVar4 = (u_char *)ngx_pnalloc(r->pool,sVar2 + sVar3 + 0x22);
    (pnVar1->file).name.data = puVar4;
    if (puVar4 == (u_char *)0x0) {
      return -1;
    }
    memcpy(puVar4,(path->name).data,(path->name).len);
    puVar4 = ngx_hex_dump((pnVar1->file).name.data + path->len + (path->name).len + 1,pnVar1->key,
                          0x10);
    *puVar4 = '\0';
    ngx_create_hashed_filename(path,(pnVar1->file).name.data,(pnVar1->file).name.len);
    log = r->connection->log;
    if ((log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,log,0,"cache file: \"%s\"",(pnVar1->file).name.data);
      return 0;
    }
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_http_file_cache_name(ngx_http_request_t *r, ngx_path_t *path)
{
    u_char            *p;
    ngx_http_cache_t  *c;

    c = r->cache;

    if (c->file.name.len) {
        return NGX_OK;
    }

    c->file.name.len = path->name.len + 1 + path->len
                       + 2 * NGX_HTTP_CACHE_KEY_LEN;

    c->file.name.data = ngx_pnalloc(r->pool, c->file.name.len + 1);
    if (c->file.name.data == NULL) {
        return NGX_ERROR;
    }

    ngx_memcpy(c->file.name.data, path->name.data, path->name.len);

    p = c->file.name.data + path->name.len + 1 + path->len;
    p = ngx_hex_dump(p, c->key, NGX_HTTP_CACHE_KEY_LEN);
    *p = '\0';

    ngx_create_hashed_filename(path, c->file.name.data, c->file.name.len);

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "cache file: \"%s\"", c->file.name.data);

    return NGX_OK;
}